

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_2::PtexUtils::anon_unknown_1::average<float>
               (float *src,int sstride,int uw,int vw,float *dst,int nchan)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  void *__s;
  undefined8 uStack_40;
  float local_38;
  int local_34;
  
  lVar6 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar6);
  local_38 = (float)uw;
  local_34 = vw;
  *(undefined8 *)((long)&uStack_40 + lVar6) = 0x11465c;
  memset(__s,0,(long)nchan << 2);
  iVar5 = sstride + 3;
  if (-1 < sstride) {
    iVar5 = sstride;
  }
  iVar3 = (iVar5 >> 2) * local_34;
  if (iVar3 != 0) {
    pfVar1 = src + iVar3;
    iVar3 = nchan * (int)local_38;
    do {
      if (iVar3 != 0) {
        pfVar2 = src + iVar3;
        do {
          if (0 < nchan) {
            lVar6 = 0;
            do {
              *(float *)((long)__s + lVar6) =
                   *(float *)((long)src + lVar6) + *(float *)((long)__s + lVar6);
              lVar6 = lVar6 + 4;
            } while ((ulong)(uint)nchan * 4 - lVar6 != 0);
            src = (float *)((long)src + lVar6);
          }
        } while (src != pfVar2);
      }
      src = src + ((iVar5 >> 2) - iVar3);
    } while (src != pfVar1);
  }
  if (0 < nchan) {
    uVar4 = 0;
    do {
      dst[uVar4] = *(float *)((long)__s + uVar4 * 4) * (1.0 / (float)(local_34 * (int)local_38));
      uVar4 = uVar4 + 1;
    } while ((uint)nchan != uVar4);
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }